

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2DocsSamples.cpp
# Opt level: O1

string * __thiscall
Greeting::getNationality_abi_cxx11_(string *__return_storage_ptr__,Greeting *this)

{
  Nationality NVar1;
  char *pcVar2;
  char *pcVar3;
  
  NVar1 = this->nationality;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (NVar1 == French) {
    pcVar3 = "French";
    pcVar2 = "";
  }
  else if (NVar1 == American) {
    pcVar3 = "American";
    pcVar2 = "";
  }
  else if (NVar1 == British) {
    pcVar3 = "British";
    pcVar2 = "";
  }
  else {
    pcVar3 = "Unknown";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getNationality() const
    {
        switch (nationality)
        {
        case British:
            return "British";
        case American:
            return "American";
        case French:
            return "French";
        default:
            return "Unknown";
        }
    }